

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStackTerminalType::~IfcStackTerminalType(IfcStackTerminalType *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x816050;
  *(undefined8 *)&this->field_0x1e0 = 0x8161b8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x816078;
  (this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8160a0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x8160c8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x8160f0;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x816118;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x816140;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x816168;
  *(undefined8 *)&(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x816190;
  puVar1 = *(undefined1 **)&(this->super_IfcFlowTerminalType).field_0x1c0;
  if (puVar1 != &this->field_0x1d0) {
    operator_delete(puVar1);
  }
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x8167e0;
  *(undefined8 *)&this->field_0x1e0 = 0x8168a8;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x816808;
  (this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x816830;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x816858;
  *(undefined8 *)
   &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x816880;
  puVar1 = *(undefined1 **)
            &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
             super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x158;
  if (puVar1 != &(this->super_IfcFlowTerminalType).super_IfcDistributionFlowElementType.
                 super_IfcDistributionElementType.super_IfcElementType.field_0x168) {
    operator_delete(puVar1);
  }
  IfcTypeProduct::~IfcTypeProduct((IfcTypeProduct *)this,&PTR_construction_vtable_24__008161f0);
  operator_delete(this);
  return;
}

Assistant:

IfcStackTerminalType() : Object("IfcStackTerminalType") {}